

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O3

void __thiscall fat::print_info(fat *this)

{
  boot_record *__s;
  size_t sVar1;
  long *plVar2;
  char *__s_00;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"BOOT RECORD",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"volume_descriptor: ",0x13);
  __s = this->fs_br;
  if (__s == (boot_record *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10e130);
  }
  else {
    sVar1 = strlen(__s->volume_descriptor);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,__s->volume_descriptor,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  printf("fat_type: %d\n",(ulong)(uint)(int)this->fs_br->fat_type);
  printf("fat_copies: %d\n",(ulong)(uint)(int)this->fs_br->fat_copies);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cluster_size: ",0xe);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->fs_br->cluster_size);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"usable_cluster_count: ",0x16);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->fs_br->usable_cluster_count)
  ;
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"signature: ",0xb);
  __s_00 = this->fs_br->signature;
  sVar1 = strlen(__s_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s_00,sVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAT table",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------------------------------------",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (0 < this->fs_br->usable_cluster_count) {
    uVar3 = 0;
    do {
      printf("[%d] %d\n",uVar3 & 0xffffffff,(ulong)(uint)this->fat_table[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)this->fs_br->usable_cluster_count);
  }
  return;
}

Assistant:

void fat::print_info() {
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "BOOT RECORD" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "volume_descriptor: " << fs_br->volume_descriptor << std::endl;
    printf("fat_type: %d\n", fs_br->fat_type);
    printf("fat_copies: %d\n", fs_br->fat_copies);
    std::cout << "cluster_size: " << fs_br->cluster_size << std::endl;
    std::cout << "usable_cluster_count: " << fs_br->usable_cluster_count << std::endl;
    std::cout << "signature: " << fs_br->signature << std::endl;

    std::cout << "--------------------------------------------------------" << std::endl;
    std::cout << "FAT table" << std::endl;
    std::cout << "--------------------------------------------------------" << std::endl;
    for (int i = 0; i < fs_br->usable_cluster_count; i++) {
        //if (fat_table[i] != FAT_UNUSED) {
        printf("[%d] %d\n", i, fat_table[i]);
        //}
    }
}